

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpActionRequest.c
# Opt level: O3

int UpnpActionRequest_assign(UpnpActionRequest *p,UpnpActionRequest *q)

{
  IXML_Document *pIVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  sockaddr_storage *psVar12;
  sockaddr_storage *psVar13;
  byte bVar14;
  
  bVar14 = 0;
  if (p == q) {
    uVar11 = 1;
  }
  else {
    iVar8 = q->m_Socket;
    p->m_ErrCode = q->m_ErrCode;
    p->m_Socket = iVar8;
    pcVar9 = UpnpString_get_String(q->m_ErrStr);
    iVar8 = UpnpString_set_String(p->m_ErrStr,pcVar9);
    uVar11 = 0;
    if (iVar8 != 0) {
      pcVar9 = UpnpString_get_String(q->m_ActionName);
      iVar8 = UpnpString_set_String(p->m_ActionName,pcVar9);
      if (iVar8 != 0) {
        pcVar9 = UpnpString_get_String(q->m_DevUDN);
        iVar8 = UpnpString_set_String(p->m_DevUDN,pcVar9);
        if (iVar8 != 0) {
          pcVar9 = UpnpString_get_String(q->m_ServiceID);
          iVar8 = UpnpString_set_String(p->m_ServiceID,pcVar9);
          uVar11 = 0;
          if (iVar8 != 0) {
            pIVar1 = q->m_ActionResult;
            p->m_ActionRequest = q->m_ActionRequest;
            p->m_ActionResult = pIVar1;
            p->m_SoapHeader = q->m_SoapHeader;
            psVar12 = &q->m_CtrlPtIPAddr;
            psVar13 = &p->m_CtrlPtIPAddr;
            for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
              cVar2 = psVar12->__ss_padding[0];
              cVar3 = psVar12->__ss_padding[1];
              cVar4 = psVar12->__ss_padding[2];
              cVar5 = psVar12->__ss_padding[3];
              cVar6 = psVar12->__ss_padding[4];
              cVar7 = psVar12->__ss_padding[5];
              psVar13->ss_family = psVar12->ss_family;
              psVar13->__ss_padding[0] = cVar2;
              psVar13->__ss_padding[1] = cVar3;
              psVar13->__ss_padding[2] = cVar4;
              psVar13->__ss_padding[3] = cVar5;
              psVar13->__ss_padding[4] = cVar6;
              psVar13->__ss_padding[5] = cVar7;
              psVar12 = (sockaddr_storage *)((long)psVar12 + (ulong)bVar14 * -0x10 + 8);
              psVar13 = (sockaddr_storage *)((long)psVar13 + (ulong)bVar14 * -0x10 + 8);
            }
            pcVar9 = UpnpString_get_String(q->m_Os);
            iVar8 = UpnpString_set_String(p->m_Os,pcVar9);
            uVar11 = (uint)(iVar8 != 0);
          }
        }
      }
    }
  }
  return uVar11;
}

Assistant:

int UpnpActionRequest_assign(UpnpActionRequest *p, const UpnpActionRequest *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpActionRequest_set_ErrCode(
				   p, UpnpActionRequest_get_ErrCode(q));
		ok = ok && UpnpActionRequest_set_Socket(
				   p, UpnpActionRequest_get_Socket(q));
		ok = ok && UpnpActionRequest_set_ErrStr(
				   p, UpnpActionRequest_get_ErrStr(q));
		ok = ok && UpnpActionRequest_set_ActionName(
				   p, UpnpActionRequest_get_ActionName(q));
		ok = ok && UpnpActionRequest_set_DevUDN(
				   p, UpnpActionRequest_get_DevUDN(q));
		ok = ok && UpnpActionRequest_set_ServiceID(
				   p, UpnpActionRequest_get_ServiceID(q));
		ok = ok && UpnpActionRequest_set_ActionRequest(
				   p, UpnpActionRequest_get_ActionRequest(q));
		ok = ok && UpnpActionRequest_set_ActionResult(
				   p, UpnpActionRequest_get_ActionResult(q));
		ok = ok && UpnpActionRequest_set_SoapHeader(
				   p, UpnpActionRequest_get_SoapHeader(q));
		ok = ok && UpnpActionRequest_set_CtrlPtIPAddr(
				   p, UpnpActionRequest_get_CtrlPtIPAddr(q));
		ok = ok &&
		     UpnpActionRequest_set_Os(p, UpnpActionRequest_get_Os(q));
	}

	return ok;
}